

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptString.cpp
# Opt level: O1

BOOL __thiscall
Js::JavascriptString::GetDiagValueString
          (JavascriptString *this,StringBuilder<Memory::ArenaAllocator> *stringBuilder,
          ScriptContext *requestContext)

{
  uint countNeeded;
  char16 *str;
  
  StringBuilder<Memory::ArenaAllocator>::Append(stringBuilder,L'\"');
  str = GetString(this);
  countNeeded = this->m_charLength;
  StringBuilder<Memory::ArenaAllocator>::EnsureBuffer(stringBuilder,countNeeded);
  CopyHelper(stringBuilder->appendPtr,str,countNeeded);
  stringBuilder->appendPtr = stringBuilder->appendPtr + countNeeded;
  stringBuilder->count = stringBuilder->count + countNeeded;
  StringBuilder<Memory::ArenaAllocator>::Append(stringBuilder,L'\"');
  return 1;
}

Assistant:

BOOL JavascriptString::GetDiagValueString(StringBuilder<ArenaAllocator>* stringBuilder, ScriptContext* requestContext)
    {
        stringBuilder->Append(_u('"'));
        stringBuilder->Append(this->GetString(), this->GetLength());
        stringBuilder->Append(_u('"'));
        return TRUE;
    }